

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

void __thiscall
QTextEditPrivate::pageUpDown(QTextEditPrivate *this,MoveOperation op,MoveMode moveMode)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int in_EDX;
  MoveMode in_ESI;
  long in_FS_OFFSET;
  QTextCursor *this_00;
  double dVar4;
  QTextCursor *pQVar5;
  qreal y;
  qreal distance;
  qreal lastY;
  bool moved;
  QTextCursor cursor;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  QTextCursor *in_stack_ffffffffffffff78;
  QWidgetTextControl *in_stack_ffffffffffffff80;
  QTextCursor *cursor_00;
  double local_58;
  QRectF local_50;
  QRectF local_30;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QWidgetTextControl::textCursor
            ((QWidgetTextControl *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  QWidgetTextControl::cursorRect(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  this_00 = (QTextCursor *)QRectF::top(&local_30);
  cursor_00 = (QTextCursor *)0x0;
  do {
    QWidgetTextControl::cursorRect((QWidgetTextControl *)cursor_00,in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff78 = (QTextCursor *)QRectF::top(&local_50);
    local_58 = (double)in_stack_ffffffffffffff78 - (double)this_00;
    dVar4 = qAbs<double>(&local_58);
    pQVar5 = (QTextCursor *)(dVar4 + (double)cursor_00);
    this_00 = in_stack_ffffffffffffff78;
    bVar2 = QTextCursor::movePosition((MoveOperation)&local_10,in_ESI,in_EDX);
    bVar1 = false;
    cursor_00 = pQVar5;
    if ((bVar2 & 1) != 0) {
      iVar3 = QWidget::height((QWidget *)0x6d09be);
      bVar1 = (double)pQVar5 < (double)iVar3;
    }
  } while (bVar1);
  if ((bVar2 & 1) != 0) {
    if (in_ESI == 2) {
      QTextCursor::movePosition((MoveOperation)&local_10,0xc,in_EDX);
      QAbstractSlider::triggerAction
                ((QAbstractSlider *)cursor_00,
                 (SliderAction)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    }
    else {
      QTextCursor::movePosition((MoveOperation)&local_10,2,in_EDX);
      QAbstractSlider::triggerAction
                ((QAbstractSlider *)cursor_00,
                 (SliderAction)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    }
  }
  QWidgetTextControl::setTextCursor
            ((QWidgetTextControl *)this_00,cursor_00,
             SUB81((ulong)in_stack_ffffffffffffff78 >> 0x38,0));
  QTextCursor::~QTextCursor((QTextCursor *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextEditPrivate::pageUpDown(QTextCursor::MoveOperation op, QTextCursor::MoveMode moveMode)
{
    QTextCursor cursor = control->textCursor();
    bool moved = false;
    qreal lastY = control->cursorRect(cursor).top();
    qreal distance = 0;
    // move using movePosition to keep the cursor's x
    do {
        qreal y = control->cursorRect(cursor).top();
        distance += qAbs(y - lastY);
        lastY = y;
        moved = cursor.movePosition(op, moveMode);
    } while (moved && distance < viewport->height());

    if (moved) {
        if (op == QTextCursor::Up) {
            cursor.movePosition(QTextCursor::Down, moveMode);
            vbar->triggerAction(QAbstractSlider::SliderPageStepSub);
        } else {
            cursor.movePosition(QTextCursor::Up, moveMode);
            vbar->triggerAction(QAbstractSlider::SliderPageStepAdd);
        }
    }
    control->setTextCursor(cursor, moveMode == QTextCursor::KeepAnchor);
}